

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg.c
# Opt level: O1

int imsg_compose(imsgbuf *ibuf,u_int32_t type,u_int32_t peerid,pid_t pid,int fd,void *data,
                u_int16_t datalen)

{
  int iVar1;
  ibuf *msg;
  int iVar2;
  
  msg = imsg_create(ibuf,type,peerid,pid,datalen);
  iVar2 = -1;
  if (msg != (ibuf *)0x0) {
    iVar1 = imsg_add(msg,data,datalen);
    if (iVar1 != -1) {
      msg->fd = fd;
      imsg_close(ibuf,msg);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int
imsg_compose(struct imsgbuf *ibuf, u_int32_t type, u_int32_t peerid,
    pid_t pid, int fd, const void *data, u_int16_t datalen)
{
	struct ibuf	*wbuf;

	if ((wbuf = imsg_create(ibuf, type, peerid, pid, datalen)) == NULL)
		return (-1);

	if (imsg_add(wbuf, data, datalen) == -1)
		return (-1);

	wbuf->fd = fd;

	imsg_close(ibuf, wbuf);

	return (1);
}